

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Bucket * __thiscall
Lib::
Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
::insert(Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
         *this,uint *key,Bucket *val,uint code)

{
  uint uVar1;
  bool bVar2;
  uint *o1;
  Bucket *pBVar3;
  uint in_ECX;
  uint *in_RSI;
  Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
  *in_RDI;
  Entry *entry;
  Bucket *in_stack_ffffffffffffff68;
  Entry *this_00;
  Entry *local_30;
  
  local_30 = firstEntryForCode(in_RDI,in_ECX);
  do {
    bVar2 = Entry::occupied(local_30);
    if (!bVar2) {
      in_RDI->_noOfEntries = in_RDI->_noOfEntries + 1;
      uVar1 = *in_RSI;
      this_00 = local_30;
      Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ::Bucket::Bucket((Bucket *)local_30,in_stack_ffffffffffffff68);
      Entry::init(this_00,(EVP_PKEY_CTX *)(ulong)uVar1);
      Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ::Bucket::~Bucket((Bucket *)this_00);
      pBVar3 = Entry::value(local_30);
      return pBVar3;
    }
    if (local_30->code == in_ECX) {
      o1 = Entry::key(local_30);
      bVar2 = DefaultHash::equals<unsigned_int>(o1,in_RSI);
      if (bVar2) {
        pBVar3 = Entry::value(local_30);
        return pBVar3;
      }
    }
    local_30 = nextEntry(in_RDI,local_30);
  } while( true );
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }